

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void __thiscall
duckdb::Vector::ToUnifiedFormat(Vector *this,idx_t count,UnifiedVectorFormat *format)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  unsigned_long *puVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  VectorBuffer *pVVar4;
  VectorBuffer *pVVar5;
  VectorChildBuffer *pVVar6;
  SelectionVector *pSVar7;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var8;
  Vector child_vector;
  shared_ptr<duckdb::VectorChildBuffer,_true> local_a8;
  Vector local_90;
  
  if (this->vector_type == CONSTANT_VECTOR) {
    pSVar7 = ConstantVector::ZeroSelectionVector(count,&format->owned_sel);
    format->sel = pSVar7;
    puVar1 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    format->data = this->data;
    (format->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar1;
  }
  else {
    if (this->vector_type == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(this);
      pVVar4 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
      shared_ptr<duckdb::SelectionData,_true>::operator=
                (&(format->owned_sel).selection_data,
                 (shared_ptr<duckdb::SelectionData,_true> *)&pVVar4[1].buffer_type);
      (format->owned_sel).sel_vector = (sel_t *)pVVar4[1]._vptr_VectorBuffer;
      format->sel = &format->owned_sel;
      DictionaryVector::VerifyDictionary(this);
      pVVar5 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->auxiliary);
      if (*(char *)&pVVar5[1]._vptr_VectorBuffer != '\0') {
        Vector(&local_90,(Vector *)(pVVar5 + 1));
        Flatten(&local_90,(SelectionVector *)(pVVar4 + 1),count);
        make_buffer<duckdb::VectorChildBuffer,duckdb::Vector>((duckdb *)&local_a8,&local_90);
        pVVar6 = shared_ptr<duckdb::VectorChildBuffer,_true>::operator->(&local_a8);
        format->data = (pVVar6->data).data;
        pVVar6 = shared_ptr<duckdb::VectorChildBuffer,_true>::operator->(&local_a8);
        FlatVector::VerifyFlatVector(&pVVar6->data);
        (format->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (pVVar6->data).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(format->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(pVVar6->data).validity.super_TemplatedValidityMask<unsigned_long>.validity_data
                  );
        _Var3._M_pi = local_a8.internal.
                      super___shared_ptr<duckdb::VectorChildBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        peVar2 = local_a8.internal.
                 super___shared_ptr<duckdb::VectorChildBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (format->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (pVVar6->data).validity.super_TemplatedValidityMask<unsigned_long>.capacity;
        local_a8.internal.super___shared_ptr<duckdb::VectorChildBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_a8.internal.super___shared_ptr<duckdb::VectorChildBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (this->auxiliary).internal.
                  super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (this->auxiliary).internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &peVar2->super_VectorBuffer;
        (this->auxiliary).internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var3._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (local_a8.internal.
            super___shared_ptr<duckdb::VectorChildBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.internal.
                     super___shared_ptr<duckdb::VectorChildBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_90.auxiliary.internal.
            super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.auxiliary.internal.
                     super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_90.buffer.internal.
            super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.buffer.internal.
                     super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        LogicalType::~LogicalType(&local_90.type);
        return;
      }
      format->data = pVVar5[1].data.pointer;
      FlatVector::VerifyFlatVector((Vector *)(pVVar5 + 1));
      (format->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)pVVar5[1].data.allocated_size;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(format->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(pVVar5 + 2));
      _Var8._M_head_impl =
           pVVar5[2].aux_data.
           super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
           .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
      goto LAB_002d4f06;
    }
    Flatten(this,count);
    FlatVector::IncrementalSelectionVector();
    format->sel = &FlatVector::IncrementalSelectionVector::INCREMENTAL_SELECTION_VECTOR;
    format->data = this->data;
    FlatVector::VerifyFlatVector(this);
    (format->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  }
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&(format->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
             &(this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
  _Var8._M_head_impl =
       (VectorAuxiliaryData *)(this->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
LAB_002d4f06:
  (format->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)_Var8._M_head_impl
  ;
  return;
}

Assistant:

void Vector::ToUnifiedFormat(idx_t count, UnifiedVectorFormat &format) {
	switch (GetVectorType()) {
	case VectorType::DICTIONARY_VECTOR: {
		auto &sel = DictionaryVector::SelVector(*this);
		format.owned_sel.Initialize(sel);
		format.sel = &format.owned_sel;

		auto &child = DictionaryVector::Child(*this);
		if (child.GetVectorType() == VectorType::FLAT_VECTOR) {
			format.data = FlatVector::GetData(child);
			format.validity = FlatVector::Validity(child);
		} else {
			// dictionary with non-flat child: create a new reference to the child and flatten it
			Vector child_vector(child);
			child_vector.Flatten(sel, count);
			auto new_aux = make_buffer<VectorChildBuffer>(std::move(child_vector));

			format.data = FlatVector::GetData(new_aux->data);
			format.validity = FlatVector::Validity(new_aux->data);
			this->auxiliary = std::move(new_aux);
		}
		break;
	}
	case VectorType::CONSTANT_VECTOR:
		format.sel = ConstantVector::ZeroSelectionVector(count, format.owned_sel);
		format.data = ConstantVector::GetData(*this);
		format.validity = ConstantVector::Validity(*this);
		break;
	default:
		Flatten(count);
		format.sel = FlatVector::IncrementalSelectionVector();
		format.data = FlatVector::GetData(*this);
		format.validity = FlatVector::Validity(*this);
		break;
	}
}